

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  Curl_easy *pCVar1;
  curl_slist *pcVar2;
  byte *pbVar3;
  int iVar4;
  Curl_HttpReq CVar5;
  CURLcode CVar6;
  byte *pbVar7;
  long lVar8;
  undefined7 in_register_00000031;
  char *pcVar9;
  curl_slist **ppcVar10;
  byte *pbVar11;
  bool bVar12;
  curl_slist *h [2];
  long local_48;
  Curl_send_buffer *req_buffer_local;
  
  req_buffer_local = req_buffer;
  pCVar1 = conn->data;
  local_48 = 1;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    if (((conn->bits).httpproxy == true) && ((conn->bits).tunnel_proxy == false)) {
      h[0] = (pCVar1->set).headers;
      if ((pCVar1->set).sep_headers == true) {
        h[1] = (pCVar1->set).proxyheaders;
        local_48 = 2;
      }
      goto LAB_00382a72;
    }
LAB_00382a66:
    h[0] = (pCVar1->set).headers;
  }
  else {
    if ((pCVar1->set).sep_headers != true) goto LAB_00382a66;
    h[0] = (pCVar1->set).proxyheaders;
  }
LAB_00382a72:
  lVar8 = 0;
  do {
    if (lVar8 == local_48) {
      return CURLE_OK;
    }
    ppcVar10 = h + lVar8;
    while (pcVar2 = *ppcVar10, pcVar2 != (curl_slist *)0x0) {
      pcVar9 = pcVar2->data;
      pbVar7 = (byte *)strchr(pcVar9,0x3a);
      if (pbVar7 == (byte *)0x0) {
        pbVar7 = (byte *)strchr(pcVar9,0x3b);
        pbVar3 = pbVar7;
        if (pbVar7 != (byte *)0x0) {
          do {
            pbVar11 = pbVar3;
            if (pbVar11[1] == 0) goto LAB_00382c13;
            iVar4 = Curl_isspace((uint)pbVar11[1]);
            pbVar3 = pbVar11 + 1;
          } while (iVar4 != 0);
          if (pbVar11[1] == 0) {
LAB_00382c13:
            if (*pbVar11 != 0x3b) goto LAB_00382ab9;
            *pbVar11 = 0x3a;
            goto LAB_00382abf;
          }
        }
      }
      else {
LAB_00382ab9:
        pbVar11 = (byte *)0x0;
LAB_00382abf:
        do {
          pbVar7 = pbVar7 + 1;
          if (*pbVar7 == 0) {
            bVar12 = false;
            goto LAB_00382ae1;
          }
          iVar4 = Curl_isspace((uint)*pbVar7);
        } while (iVar4 != 0);
        bVar12 = *pbVar7 != 0;
LAB_00382ae1:
        if ((pbVar11 != (byte *)0x0) || (bVar12)) {
          pcVar9 = pcVar2->data;
          if ((conn->allocptr).host == (char *)0x0) {
LAB_00382b15:
            CVar5 = (pCVar1->set).httpreq;
            if (CVar5 == HTTPREQ_POST_FORM) {
              iVar4 = curl_strnequal("Content-Type:",pcVar9,0xd);
              if (iVar4 != 0) goto LAB_00382bc0;
              CVar5 = (pCVar1->set).httpreq;
              pcVar9 = pcVar2->data;
            }
            if (CVar5 == HTTPREQ_POST_MIME) {
              iVar4 = curl_strnequal("Content-Type:",pcVar9,0xd);
              if (iVar4 != 0) goto LAB_00382bc0;
              pcVar9 = pcVar2->data;
            }
            if ((conn->bits).authneg == true) {
              iVar4 = curl_strnequal("Content-Length:",pcVar9,0xf);
              if (iVar4 != 0) goto LAB_00382bc0;
              pcVar9 = pcVar2->data;
            }
            if ((conn->allocptr).te != (char *)0x0) {
              iVar4 = curl_strnequal("Connection:",pcVar9,0xb);
              if (iVar4 != 0) goto LAB_00382bc0;
              pcVar9 = pcVar2->data;
            }
            if (conn->httpversion == 0x14) {
              iVar4 = curl_strnequal("Transfer-Encoding:",pcVar9,0x12);
              if (iVar4 != 0) goto LAB_00382bc0;
              pcVar9 = pcVar2->data;
            }
            iVar4 = curl_strnequal("Authorization:",pcVar9,0xe);
            if ((((iVar4 != 0) && ((pCVar1->state).this_is_a_follow == true)) &&
                (pcVar9 = (pCVar1->state).first_host, pcVar9 != (char *)0x0)) &&
               (((pCVar1->set).allow_auth_to_other_hosts == false &&
                (iVar4 = Curl_strcasecompare(pcVar9,(conn->host).name), iVar4 == 0))))
            goto LAB_00382bc0;
            CVar6 = Curl_add_bufferf(&req_buffer_local,"%s\r\n",pcVar2->data);
          }
          else {
            iVar4 = curl_strnequal("Host:",pcVar9,5);
            if (iVar4 == 0) {
              pcVar9 = pcVar2->data;
              goto LAB_00382b15;
            }
LAB_00382bc0:
            CVar6 = CURLE_OK;
          }
          if (pbVar11 != (byte *)0x0) {
            *pbVar11 = 0x3b;
          }
          if (CVar6 != CURLE_OK) {
            return CVar6;
          }
        }
      }
      ppcVar10 = &pcVar2->next;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* send no-value custom header if terminated by semicolon */
              *ptr = ':';
              semicolonp = ptr;
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", headers->data))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", headers->data))
            ;
          else if((conn->httpversion == 20) &&
                  checkprefix("Transfer-Encoding:", headers->data))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if(checkprefix("Authorization:", headers->data) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
            result = Curl_add_bufferf(&req_buffer, "%s\r\n", headers->data);
          }
          if(semicolonp)
            *semicolonp = ';'; /* put back the semicolon */
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}